

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj2pbrt.cpp
# Opt level: O0

bool __thiscall
tinyobj::MaterialFileReader::operator()
          (MaterialFileReader *this,string *matId,
          vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *materials,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          *matMap,string *err)

{
  byte bVar1;
  ulong uVar2;
  undefined8 uVar3;
  ostream *poVar4;
  string *in_RSI;
  long in_RDI;
  string *in_R8;
  stringstream ss;
  ifstream matIStream;
  string filepath;
  istream *in_stack_00000fa0;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> *in_stack_00000fa8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000fb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffba0;
  undefined7 in_stack_fffffffffffffba8;
  undefined1 in_stack_fffffffffffffbaf;
  string local_448 [32];
  stringstream local_428 [16];
  ostream local_418 [376];
  long local_2a0 [67];
  string local_88 [32];
  string local_68 [32];
  string local_48 [32];
  string *local_28;
  string *local_10;
  
  local_28 = in_R8;
  local_10 = in_RSI;
  std::__cxx11::string::string(local_48);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::__cxx11::string::string(local_88,(string *)(in_RDI + 8));
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffbaf,in_stack_fffffffffffffba8),
                   in_stack_fffffffffffffba0);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    std::__cxx11::string::~string(local_88);
  }
  else {
    std::__cxx11::string::operator=(local_48,local_10);
  }
  uVar3 = std::__cxx11::string::c_str();
  std::ifstream::ifstream(local_2a0,uVar3,8);
  LoadMtl(in_stack_00000fb0,in_stack_00000fa8,in_stack_00000fa0);
  bVar1 = std::ios::operator!((ios *)((long)local_2a0 + *(long *)(local_2a0[0] + -0x18)));
  if ((bVar1 & 1) != 0) {
    std::__cxx11::stringstream::stringstream(local_428);
    poVar4 = std::operator<<(local_418,"WARN: Material file [ ");
    poVar4 = std::operator<<(poVar4,local_48);
    std::operator<<(poVar4," ] not found. Created a default material.");
    std::__cxx11::stringstream::str();
    std::__cxx11::string::operator+=(local_28,local_448);
    std::__cxx11::string::~string(local_448);
    std::__cxx11::stringstream::~stringstream(local_428);
  }
  std::ifstream::~ifstream(local_2a0);
  std::__cxx11::string::~string(local_48);
  return true;
}

Assistant:

bool MaterialFileReader::operator()(const std::string &matId,
                                    std::vector<material_t> &materials,
                                    std::map<std::string, int> &matMap,
                                    std::string &err) {
  std::string filepath;

  if (!m_mtlBasePath.empty()) {
    filepath = std::string(m_mtlBasePath) + matId;
  } else {
    filepath = matId;
  }

  std::ifstream matIStream(filepath.c_str());
  LoadMtl(matMap, materials, matIStream);
  if (!matIStream) {
    std::stringstream ss;
    ss << "WARN: Material file [ " << filepath
       << " ] not found. Created a default material.";
    err += ss.str();
  }
  return true;
}